

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ConstLocalIterators_Test<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::~HashtableAllTest_ConstLocalIterators_Test
          (HashtableAllTest_ConstLocalIterators_Test<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  void *in_RDI;
  
  ~HashtableAllTest_ConstLocalIterators_Test
            ((HashtableAllTest_ConstLocalIterators_Test<google::HashtableInterface_DenseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              *)0xae86f8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ConstLocalIterators) {
  this->ht_.insert(this->UniqueObject(1));
  const typename TypeParam::size_type bucknum =
      this->ht_.bucket(this->UniqueKey(1));
  typename TypeParam::const_local_iterator b = this->ht_.begin(bucknum);
  typename TypeParam::const_local_iterator e = this->ht_.end(bucknum);
  EXPECT_TRUE(b != e);
  b++;
  EXPECT_TRUE(b == e);
  typename TypeParam::const_local_iterator b2 = this->ht_.begin(bucknum ^ 1);
  typename TypeParam::const_local_iterator e2 = this->ht_.end(bucknum ^ 1);
  EXPECT_TRUE(b2 == e2);
}